

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O1

string * __thiscall hdc::Def::getUniqueCppName_abi_cxx11_(string *__return_storage_ptr__,Def *this)

{
  pointer pcVar1;
  ostream *poVar2;
  string *psVar3;
  stringstream s;
  char *local_1c0;
  long local_1b8;
  char local_1b0 [16];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (this->klass == (Class *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"d",1);
    poVar2 = (ostream *)std::ostream::operator<<(local_190,this->id);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
    psVar3 = Token::getLexem_abi_cxx11_(&this->name);
    local_1c0 = local_1b0;
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,pcVar1,pcVar1 + psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1c0,local_1b8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"m",1);
    poVar2 = (ostream *)std::ostream::operator<<(local_190,this->id);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
    psVar3 = Token::getLexem_abi_cxx11_(&this->name);
    local_1c0 = local_1b0;
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,pcVar1,pcVar1 + psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1c0,local_1b8);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Def::getUniqueCppName() {
    std::stringstream s;

    if (isMethod()) {
        s << "m" << id << "_" << getName();
    } else {
        s << "d" << id << "_" << getName();
    }

    return s.str();
}